

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_shri_with_rndacc
               (TCGContext_conflict1 *tcg_ctx,TCGv_i64 tcg_res,TCGv_i64 tcg_src,TCGv_i64 tcg_rnd,
               _Bool accumulate,_Bool is_u,int size,int shift)

{
  TCGTemp *a3;
  TCGv_i64 bh;
  int64_t arg2;
  uintptr_t o_3;
  TCGv_i64 pTVar1;
  undefined7 in_register_00000089;
  TCGv_i64 ret;
  char cVar2;
  uintptr_t o_11;
  uintptr_t o;
  uintptr_t o_2;
  
  pTVar1 = (TCGv_i64)(CONCAT71(in_register_00000089,is_u) & 0xffffffff);
  cVar2 = (char)pTVar1;
  if (size == 3 && tcg_rnd != (TCGv_i64)0x0) {
    a3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)a3 - (long)tcg_ctx);
    bh = tcg_const_i64_aarch64(tcg_ctx,0);
    pTVar1 = bh;
    if (cVar2 == '\0') {
      tcg_gen_sari_i64_aarch64(tcg_ctx,ret,tcg_src,0x3f);
      pTVar1 = ret;
    }
    tcg_gen_add2_i64_aarch64(tcg_ctx,tcg_src,ret,tcg_src,pTVar1,tcg_rnd,bh);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(bh + (long)tcg_ctx));
    if (shift == 0x40) {
      pTVar1 = tcg_src;
      if (ret != tcg_src) {
        tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                            (TCGArg)a3);
        pTVar1 = ret;
      }
    }
    else {
      tcg_gen_shri_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
      tcg_gen_shli_i64_aarch64(tcg_ctx,ret,ret,(long)(0x40 - shift));
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i64,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),(TCGArg)a3);
      pTVar1 = ret;
    }
  }
  else {
    if ((cVar2 == '\x01' && !accumulate) && shift == 0x40) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_res + (long)tcg_ctx),0);
      return;
    }
    if (tcg_rnd != (TCGv_i64)0x0) {
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),
                          (TCGArg)(tcg_rnd + (long)tcg_ctx));
    }
    if (cVar2 == '\0') {
      if (shift == 0x40) {
        arg2 = 0x3f;
      }
      else {
        arg2 = (int64_t)shift;
      }
      tcg_gen_sari_i64_aarch64(tcg_ctx,tcg_src,tcg_src,arg2);
    }
    else if (shift == 0x40) {
      tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_src + (long)&tcg_ctx->pool_cur),0);
    }
    else {
      tcg_gen_shri_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
    }
  }
  if (accumulate) {
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(tcg_res + (long)tcg_ctx),
                        (TCGArg)(tcg_res + (long)tcg_ctx),(TCGArg)(tcg_src + (long)tcg_ctx));
  }
  else if (tcg_res != tcg_src) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_res + (long)tcg_ctx),
                        (TCGArg)(tcg_src + (long)tcg_ctx));
  }
  if (size == 3 && tcg_rnd != (TCGv_i64)0x0) {
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void handle_shri_with_rndacc(TCGContext *tcg_ctx, TCGv_i64 tcg_res, TCGv_i64 tcg_src,
                                    TCGv_i64 tcg_rnd, bool accumulate,
                                    bool is_u, int size, int shift)
{
    bool extended_result = false;
    bool round = tcg_rnd != NULL;
    int ext_lshift = 0;
    TCGv_i64 tcg_src_hi;

    if (round && size == 3) {
        extended_result = true;
        ext_lshift = 64 - shift;
        tcg_src_hi = tcg_temp_new_i64(tcg_ctx);
    } else if (shift == 64) {
        if (!accumulate && is_u) {
            /* result is zero */
            tcg_gen_movi_i64(tcg_ctx, tcg_res, 0);
            return;
        }
    }

    /* Deal with the rounding step */
    if (round) {
        if (extended_result) {
            TCGv_i64 tcg_zero = tcg_const_i64(tcg_ctx, 0);
            if (!is_u) {
                /* take care of sign extending tcg_res */
                tcg_gen_sari_i64(tcg_ctx, tcg_src_hi, tcg_src, 63);
                tcg_gen_add2_i64(tcg_ctx, tcg_src, tcg_src_hi,
                                 tcg_src, tcg_src_hi,
                                 tcg_rnd, tcg_zero);
            } else {
                tcg_gen_add2_i64(tcg_ctx, tcg_src, tcg_src_hi,
                                 tcg_src, tcg_zero,
                                 tcg_rnd, tcg_zero);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_zero);
        } else {
            tcg_gen_add_i64(tcg_ctx, tcg_src, tcg_src, tcg_rnd);
        }
    }

    /* Now do the shift right */
    if (round && extended_result) {
        /* extended case, >64 bit precision required */
        if (ext_lshift == 0) {
            /* special case, only high bits matter */
            tcg_gen_mov_i64(tcg_ctx, tcg_src, tcg_src_hi);
        } else {
            tcg_gen_shri_i64(tcg_ctx, tcg_src, tcg_src, shift);
            tcg_gen_shli_i64(tcg_ctx, tcg_src_hi, tcg_src_hi, ext_lshift);
            tcg_gen_or_i64(tcg_ctx, tcg_src, tcg_src, tcg_src_hi);
        }
    } else {
        if (is_u) {
            if (shift == 64) {
                /* essentially shifting in 64 zeros */
                tcg_gen_movi_i64(tcg_ctx, tcg_src, 0);
            } else {
                tcg_gen_shri_i64(tcg_ctx, tcg_src, tcg_src, shift);
            }
        } else {
            if (shift == 64) {
                /* effectively extending the sign-bit */
                tcg_gen_sari_i64(tcg_ctx, tcg_src, tcg_src, 63);
            } else {
                tcg_gen_sari_i64(tcg_ctx, tcg_src, tcg_src, shift);
            }
        }
    }

    if (accumulate) {
        tcg_gen_add_i64(tcg_ctx, tcg_res, tcg_res, tcg_src);
    } else {
        tcg_gen_mov_i64(tcg_ctx, tcg_res, tcg_src);
    }

    if (extended_result) {
        tcg_temp_free_i64(tcg_ctx, tcg_src_hi);
    }
}